

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlSplitQName4(xmlChar *name,xmlChar **prefixPtr)

{
  xmlChar *pxVar1;
  bool bVar2;
  int local_2c;
  int l;
  xmlChar *prefix;
  xmlChar **prefixPtr_local;
  xmlChar *name_local;
  
  local_2c = 0;
  if ((name == (xmlChar *)0x0) || (prefixPtr == (xmlChar **)0x0)) {
    name_local = (xmlChar *)0x0;
  }
  else {
    *prefixPtr = (xmlChar *)0x0;
    name_local = name;
    if (*name != ':') {
      while( true ) {
        bVar2 = false;
        if (name[local_2c] != '\0') {
          bVar2 = name[local_2c] != ':';
        }
        if (!bVar2) break;
        local_2c = local_2c + 1;
      }
      if ((name[local_2c] != '\0') && (name[local_2c + 1] != '\0')) {
        pxVar1 = xmlStrndup(name,local_2c);
        if (pxVar1 == (xmlChar *)0x0) {
          name_local = (xmlChar *)0x0;
        }
        else {
          *prefixPtr = pxVar1;
          name_local = name + (local_2c + 1);
        }
      }
    }
  }
  return name_local;
}

Assistant:

const xmlChar *
xmlSplitQName4(const xmlChar *name, xmlChar **prefixPtr) {
    xmlChar *prefix;
    int l = 0;

    if ((name == NULL) || (prefixPtr == NULL))
        return(NULL);

    *prefixPtr = NULL;

    /* nasty but valid */
    if (name[0] == ':')
	return(name);

    /*
     * we are not trying to validate but just to cut, and yes it will
     * work even if this is as set of UTF-8 encoded chars
     */
    while ((name[l] != 0) && (name[l] != ':'))
	l++;

    /*
     * TODO: What about names with multiple colons?
     */
    if ((name[l] == 0) || (name[l+1] == 0))
	return(name);

    prefix = xmlStrndup(name, l);
    if (prefix == NULL)
        return(NULL);

    *prefixPtr = prefix;
    return(&name[l+1]);
}